

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

uint8_t * uprv_eastrncpy_63(uint8_t *dst,uint8_t *src,int32_t n)

{
  size_t sVar1;
  uint8_t local_29;
  char ch;
  uint8_t *orig_dst;
  byte *pbStack_18;
  int32_t n_local;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  orig_dst._4_4_ = n;
  pbStack_18 = src;
  src_local = dst;
  if (n == -1) {
    sVar1 = strlen((char *)src);
    orig_dst._4_4_ = (int)sVar1 + 1;
  }
  for (; *pbStack_18 != 0 && 0 < orig_dst._4_4_; orig_dst._4_4_ = orig_dst._4_4_ + -1) {
    local_29 = ""[*pbStack_18];
    if (local_29 == '\0') {
      local_29 = 'o';
    }
    *src_local = local_29;
    pbStack_18 = pbStack_18 + 1;
    src_local = src_local + 1;
  }
  for (; 0 < orig_dst._4_4_; orig_dst._4_4_ = orig_dst._4_4_ + -1) {
    *src_local = '\0';
    src_local = src_local + 1;
  }
  return dst;
}

Assistant:

U_INTERNAL uint8_t* U_EXPORT2
uprv_eastrncpy(uint8_t *dst, const uint8_t *src, int32_t n)
{
  uint8_t *orig_dst = dst;

  if(n==-1) { 
    n = static_cast<int32_t>(uprv_strlen((const char*)src)+1); /* copy NUL */
  }
  /* copy non-null */
  while(*src && n>0) {
    char ch = ebcdicFromAscii[*(src++)];
    if(ch == 0) {
      ch = ebcdicFromAscii[0x3f]; /* questionmark (subchar) */
    }
    *(dst++) = ch;
    n--;
  }
  /* pad */
  while(n>0) {
    *(dst++) = 0;
    n--;
  }
  return orig_dst;
}